

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_socket_log.c
# Opt level: O0

void backend_socket_log(Seat *seat,LogContext *logctx,PlugLogType type,SockAddr *addr,int port,
                       char *error_msg,int error_code,Conf *conf,_Bool session_started)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  uint local_158;
  int log_to_term;
  int len;
  char *msg;
  char addrbuf [256];
  _Bool session_started_local;
  char *error_msg_local;
  int port_local;
  SockAddr *addr_local;
  PlugLogType type_local;
  LogContext *logctx_local;
  Seat *seat_local;
  
  switch(type) {
  case PLUGLOG_CONNECT_TRYING:
    sk_getaddr(addr,(char *)&msg,0x100);
    _Var1 = sk_addr_needs_port(addr);
    if (_Var1) {
      _log_to_term = dupprintf("Connecting to %s port %d",&msg,(ulong)(uint)port);
    }
    else {
      _log_to_term = dupprintf("Connecting to %s",&msg);
    }
    break;
  case PLUGLOG_CONNECT_FAILED:
    sk_getaddr(addr,(char *)&msg,0x100);
    _log_to_term = dupprintf("Failed to connect to %s: %s",&msg,error_msg);
    break;
  case PLUGLOG_CONNECT_SUCCESS:
    if (addr == (SockAddr *)0x0) {
      sprintf((char *)&msg,"remote host");
    }
    else {
      sk_getaddr(addr,(char *)&msg,0x100);
    }
    _log_to_term = dupprintf("Connected to %s",&msg);
    break;
  case PLUGLOG_PROXY_MSG:
    _log_to_term = dupprintf("%s\r\n",error_msg);
    sVar3 = strlen(_log_to_term);
    iVar2 = (int)sVar3;
    if (iVar2 < 2) {
      __assert_fail("len >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/backend_socket_log.c"
                    ,0x2a,
                    "void backend_socket_log(Seat *, LogContext *, PlugLogType, SockAddr *, int, const char *, int, Conf *, _Bool)"
                   );
    }
    local_158 = conf_get_int(conf,0x13);
    if (local_158 == 2) {
      local_158 = (uint)session_started;
    }
    if (local_158 == 0) {
      seat_stderr(seat,_log_to_term,(long)iVar2);
    }
    _log_to_term[iVar2 + -2] = '\0';
    break;
  default:
    _log_to_term = (char *)0x0;
  }
  if (_log_to_term != (char *)0x0) {
    logevent(logctx,_log_to_term);
    safefree(_log_to_term);
  }
  return;
}

Assistant:

void backend_socket_log(Seat *seat, LogContext *logctx,
                        PlugLogType type, SockAddr *addr, int port,
                        const char *error_msg, int error_code, Conf *conf,
                        bool session_started)
{
    char addrbuf[256], *msg;

    switch (type) {
      case PLUGLOG_CONNECT_TRYING:
        sk_getaddr(addr, addrbuf, lenof(addrbuf));
        if (sk_addr_needs_port(addr)) {
            msg = dupprintf("Connecting to %s port %d", addrbuf, port);
        } else {
            msg = dupprintf("Connecting to %s", addrbuf);
        }
        break;
      case PLUGLOG_CONNECT_FAILED:
        sk_getaddr(addr, addrbuf, lenof(addrbuf));
        msg = dupprintf("Failed to connect to %s: %s", addrbuf, error_msg);
        break;
      case PLUGLOG_CONNECT_SUCCESS:
        if (addr)
            sk_getaddr(addr, addrbuf, lenof(addrbuf));
        else /* fallback if address unavailable */
            sprintf(addrbuf, "remote host");
        msg = dupprintf("Connected to %s", addrbuf);
        break;
      case PLUGLOG_PROXY_MSG: {
        /* Proxy-related log messages have their own identifying
         * prefix already, put on by our caller. */
        int len, log_to_term;

        /* Suffix \r\n temporarily, so we can log to the terminal. */
        msg = dupprintf("%s\r\n", error_msg);
        len = strlen(msg);
        assert(len >= 2);

        log_to_term = conf_get_int(conf, CONF_proxy_log_to_term);
        if (log_to_term == AUTO)
            log_to_term = session_started ? FORCE_OFF : FORCE_ON;
        if (log_to_term == FORCE_ON)
            seat_stderr(seat, msg, len);

        msg[len-2] = '\0';         /* remove the \r\n again */
        break;
      }
      default:
        msg = NULL;  /* shouldn't happen, but placate optimiser */
        break;
    }

    if (msg) {
        logevent(logctx, msg);
        sfree(msg);
    }
}